

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O2

double Memory::CustomHeap::log2(double __x)

{
  int i;
  uint uVar1;
  ulong in_RDI;
  
  for (uVar1 = 4; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    if ((*(uint *)(&DAT_00eb5810 + (ulong)uVar1 * 4) & (uint)in_RDI) != 0) {
      in_RDI = in_RDI >> ((byte)*(undefined4 *)(&DAT_00eb5830 + (ulong)uVar1 * 4) & 0x3f);
    }
  }
  return __x;
}

Assistant:

inline unsigned int log2(size_t number)
{
    const unsigned int b[] = {0x2, 0xC, 0xF0, 0xFF00, 0xFFFF0000};
    const unsigned int S[] = {1, 2, 4, 8, 16};

    unsigned int result = 0;
    for (int i = 4; i >= 0; i--)
    {
        if (number & b[i])
        {
            number >>= S[i];
            result |= S[i];
        }
    }

    return result;
}